

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

Vector3f pbrt::SampleHenyeyGreenstein(Vector3f *wo,Float g,Point2f *u,Float *pdf)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Tuple3<pbrt::Vector3,_float> TVar4;
  Float *in_RDX;
  Tuple2<pbrt::Point2,_float> *in_RSI;
  Vector3f *in_RDI;
  float in_XMM0_Da;
  float fVar5;
  Float FVar6;
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar11 [56];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  Vector3f VVar12;
  Frame wFrame;
  Float phi;
  Float sinTheta;
  Float sqrTerm;
  Float cosTheta;
  Vector3f wi;
  Float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  Vector3f *in_stack_ffffffffffffff70;
  Float in_stack_ffffffffffffff78;
  undefined4 local_34;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  undefined4 uVar13;
  undefined4 uStack_8;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  fVar5 = in_XMM0_Da;
  std::abs((int)in_RDI);
  if (0.001 <= fVar5) {
    auVar2 = vfmadd213ss_fma(ZEXT416((uint)in_XMM0_Da),ZEXT416((uint)-in_XMM0_Da),
                             SUB6416(ZEXT464(0x3f800000),0));
    in_stack_ffffffffffffff54 = in_XMM0_Da * 2.0;
    auVar8._0_4_ = Tuple2<pbrt::Point2,_float>::operator[](in_RSI,0);
    auVar8._4_60_ = extraout_var_00;
    auVar3 = vfmadd213ss_fma(auVar8._0_16_,ZEXT416((uint)-in_stack_ffffffffffffff54),
                             ZEXT416((uint)(in_XMM0_Da + 1.0)));
    fVar5 = auVar2._0_4_ / auVar3._0_4_;
    auVar2 = vfmadd213ss_fma(ZEXT416((uint)in_XMM0_Da),ZEXT416((uint)in_XMM0_Da),
                             SUB6416(ZEXT464(0x3f800000),0));
    auVar2 = vfmadd213ss_fma(ZEXT416((uint)fVar5),ZEXT416((uint)-fVar5),auVar2);
    local_34 = -auVar2._0_4_ / (in_XMM0_Da * 2.0);
  }
  else {
    auVar7._0_4_ = Tuple2<pbrt::Point2,_float>::operator[](in_RSI,0);
    auVar7._4_60_ = extraout_var;
    auVar2 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar7._0_16_,
                             SUB6416(ZEXT464(0x3f800000),0));
    local_34 = auVar2._0_4_;
  }
  vfnmadd213ss_fma(ZEXT416((uint)local_34),ZEXT416((uint)local_34),SUB6416(ZEXT464(0x3f800000),0));
  SafeSqrt(0.0);
  Tuple2<pbrt::Point2,_float>::operator[](in_RSI,1);
  Frame::FromZ(in_stack_ffffffffffffff70);
  auVar11 = (undefined1  [56])0x0;
  VVar12 = SphericalDirection(in_stack_ffffffffffffff78,
                              (Float)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                              SUB84(in_stack_ffffffffffffff70,0));
  auVar9._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar11;
  vmovlpd_avx(auVar9._0_16_);
  VVar12 = Frame::FromLocal((Frame *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                            in_RDI);
  auVar10._0_8_ = VVar12.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar10._8_56_ = auVar11;
  uVar1 = vmovlpd_avx(auVar10._0_16_);
  uVar13 = (undefined4)uVar1;
  uStack_8 = (undefined4)((ulong)uVar1 >> 0x20);
  if (in_RDX != (Float *)0x0) {
    FVar6 = HenyeyGreenstein(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50);
    *in_RDX = FVar6;
  }
  TVar4.y = (float)uStack_8;
  TVar4.x = (float)uVar13;
  TVar4.z = VVar12.super_Tuple3<pbrt::Vector3,_float>.z;
  return (Vector3f)TVar4;
}

Assistant:

Vector3f SampleHenyeyGreenstein(const Vector3f &wo, Float g, const Point2f &u,
                                Float *pdf) {
    // Compute $\cos \theta$ for Henyey--Greenstein sample
    Float cosTheta;
    if (std::abs(g) < 1e-3)
        cosTheta = 1 - 2 * u[0];
    else {
        Float sqrTerm = (1 - g * g) / (1 + g - 2 * g * u[0]);
        cosTheta = -(1 + g * g - sqrTerm * sqrTerm) / (2 * g);
    }

    // Compute direction _wi_ for Henyey--Greenstein sample
    Float sinTheta = SafeSqrt(1 - cosTheta * cosTheta);
    Float phi = 2 * Pi * u[1];
    Frame wFrame = Frame::FromZ(wo);
    Vector3f wi = wFrame.FromLocal(SphericalDirection(sinTheta, cosTheta, phi));

    if (pdf)
        *pdf = HenyeyGreenstein(cosTheta, g);
    return wi;
}